

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O0

ManagedDescriptor * __thiscall ManagedDescriptor::reset(ManagedDescriptor *this,FileDescriptor *fd)

{
  FileDescriptor *fd_local;
  ManagedDescriptor *this_local;
  
  close(this,(int)fd);
  this->_descriptor = *fd;
  this->_closedProperly = false;
  *fd = -1;
  return this;
}

Assistant:

ManagedDescriptor &reset(FileDescriptor &fd) {
    close();
    _descriptor = fd;
#ifndef NDEBUG
    _closedProperly = false;
#endif
    fd = fdTraits::InvalidDescriptor;
    return *this;
  }